

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

void __thiscall dg::llvmdg::CallGraph::CallGraph(CallGraph *this,Module *m)

{
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> _Var1;
  
  _Var1._M_head_impl = (CallGraphImpl *)operator_new(0xe0);
  (_Var1._M_head_impl)->_vptr_CallGraphImpl = (_func_int **)&PTR__LazyLLVMCallGraph_00120b98;
  _Var1._M_head_impl[5]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[6]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[1]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[2]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[3]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[4]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[5]._vptr_CallGraphImpl = (_func_int **)(_Var1._M_head_impl + 3);
  _Var1._M_head_impl[6]._vptr_CallGraphImpl = (_func_int **)(_Var1._M_head_impl + 3);
  _Var1._M_head_impl[7]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[8]._vptr_CallGraphImpl = (_func_int **)m;
  _Var1._M_head_impl[9]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[10]._vptr_CallGraphImpl = (_func_int **)(_Var1._M_head_impl + 0x10);
  _Var1._M_head_impl[0xb]._vptr_CallGraphImpl = (_func_int **)0x1;
  _Var1._M_head_impl[0xc]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[0xd]._vptr_CallGraphImpl = (_func_int **)0x0;
  *(undefined4 *)&_Var1._M_head_impl[0xe]._vptr_CallGraphImpl = 0x3f800000;
  _Var1._M_head_impl[0xf]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[0x10]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[0x11]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[0x12]._vptr_CallGraphImpl = (_func_int **)0x0;
  *(undefined8 *)((long)(_Var1._M_head_impl + 0x12) + 1) = 0;
  *(undefined8 *)((long)(_Var1._M_head_impl + 0x13) + 1) = 0;
  _Var1._M_head_impl[0x15]._vptr_CallGraphImpl = (_func_int **)(_Var1._M_head_impl + 0x1b);
  _Var1._M_head_impl[0x16]._vptr_CallGraphImpl = (_func_int **)0x1;
  _Var1._M_head_impl[0x17]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[0x18]._vptr_CallGraphImpl = (_func_int **)0x0;
  *(undefined4 *)&_Var1._M_head_impl[0x19]._vptr_CallGraphImpl = 0x3f800000;
  _Var1._M_head_impl[0x1a]._vptr_CallGraphImpl = (_func_int **)0x0;
  _Var1._M_head_impl[0x1b]._vptr_CallGraphImpl = (_func_int **)0x0;
  (this->_impl)._M_t.
  super___uniq_ptr_impl<dg::llvmdg::CallGraphImpl,_std::default_delete<dg::llvmdg::CallGraphImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::llvmdg::CallGraphImpl_*,_std::default_delete<dg::llvmdg::CallGraphImpl>_>
  .super__Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

CallGraph(const llvm::Module *m) : _impl(new LazyLLVMCallGraph(m)) {}